

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O2

cmListFileContext *
cmListFileContext::FromListFilePath(cmListFileContext *__return_storage_ptr__,string *filePath)

{
  cmListFileContext(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->FilePath);
  return __return_storage_ptr__;
}

Assistant:

static cmListFileContext FromListFilePath(std::string const& filePath)
  {
    // We are entering a file-level scope but have not yet reached
    // any specific line or command invocation within it.  This context
    // is useful to print when it is at the top but otherwise can be
    // skipped during call stack printing.
    cmListFileContext lfc;
    lfc.FilePath = filePath;
    return lfc;
  }